

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O2

bool __thiscall
units::fixed_precise_measurement::operator==(fixed_precise_measurement *this,double val)

{
  double val1;
  bool bVar1;
  
  val1 = this->value_;
  if ((val1 == val) && (!NAN(val1) && !NAN(val))) {
    return true;
  }
  bVar1 = detail::compare_round_equals_precise(val1,val);
  return bVar1;
}

Assistant:

bool operator==(double val) const
    {
        return (value_ == val) ?
            true :
            detail::compare_round_equals_precise(value_, val);
    }